

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighteraxe.cpp
# Opt level: O2

int AF_A_FAxeAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  PClass *pPVar1;
  VM_UBYTE VVar2;
  int iVar3;
  int damage;
  DObject *this;
  player_t *ppVar4;
  APlayerPawn *t1;
  AWeapon *pAVar5;
  AActor *pAVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  AAmmo *pAVar10;
  FState *pFVar11;
  char *pcVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  DObject *this_00;
  int iVar16;
  uint uVar17;
  FName local_bc;
  double local_b8;
  PClassActor *local_b0;
  player_t *local_a8;
  DAngle local_a0;
  DAngle local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  FName local_78;
  FName local_74;
  FTranslatedLineTarget t;
  undefined1 local_58 [32];
  DAngle local_38;
  
  if (numparam < 1) {
    pcVar12 = "(paramnum) < numparam";
    goto LAB_00538ef3;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_00538ee3;
  this_00 = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this_00 == (DObject *)0x0) goto LAB_00538ae4;
    bVar7 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    if (!bVar7) {
      pcVar12 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00538ef3;
    }
  }
  else {
    if (this_00 != (DObject *)0x0) goto LAB_00538ee3;
LAB_00538ae4:
    this_00 = (DObject *)0x0;
  }
  if (numparam == 1) goto LAB_00538b61;
  VVar2 = param[1].field_0.field_3.Type;
  if (VVar2 != 0xff) {
    if (VVar2 != '\x03') {
LAB_00538ee3:
      pcVar12 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_00538ef3;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar7 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar7)) {
        pcVar12 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_00538ef3;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_00538ee3;
  }
  if ((((uint)numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
     ((VVar2 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00538b61:
    ppVar4 = *(player_t **)&this_00[0xc].ObjectFlags;
    if (ppVar4 != (player_t *)0x0) {
      t1 = ppVar4->mo;
      uVar8 = FRandom::operator()(&pr_axeatk);
      uVar9 = FRandom::operator()(&pr_axeatk);
      pAVar10 = GC::ReadBarrier<AAmmo>((AAmmo **)&ppVar4->ReadyWeapon->Ammo1);
      iVar3 = (pAVar10->super_AInventory).Amount;
      pcVar12 = "AxePuff";
      if (iVar3 < 1) {
        uVar17 = 0;
      }
      else {
        pcVar12 = "AxePuffGlow";
        uVar17 = 0x40180000;
      }
      local_b8 = (double)((ulong)uVar17 << 0x20);
      damage = (uVar9 & 7) + (uVar8 & 0xf) + 0x28 << (0 < iVar3);
      local_a8 = ppVar4;
      local_b0 = PClass::FindActor(pcVar12);
      iVar16 = 0;
      for (iVar14 = 0; iVar14 != 0x10; iVar14 = iVar14 + 1) {
        iVar13 = iVar14;
        for (iVar15 = 1; -2 < iVar15; iVar15 = iVar15 + -2) {
          pAVar6 = (AActor *)((double)iVar13 * 2.8125 + (t1->super_AActor).Angles.Yaw.Degrees);
          local_90 = 0;
          local_88._0_8_ = pAVar6;
          P_AimLineAttack((AActor *)(local_88 + 8),(DAngle *)t1,144.0,
                          (FTranslatedLineTarget *)local_88,(DAngle *)&t,(int)&local_90,
                          (AActor *)0x0,(AActor *)0x0);
          if (t.linetarget != (AActor *)0x0) {
            local_a0.Degrees = (double)local_88._8_8_;
            local_bc.Index = 0x84;
            local_98.Degrees = (double)pAVar6;
            P_LineAttack(&t1->super_AActor,&local_98,144.0,&local_a0,damage,&local_bc,local_b0,1,&t,
                         (int *)0x0);
            if (t.linetarget != (AActor *)0x0) {
              if (((((t.linetarget)->flags3).Value & 0x2000) != 0) ||
                 ((t.linetarget)->player != (player_t *)0x0)) {
                local_38.Degrees = t.angleFromSource.Degrees;
                AActor::Thrust(t.linetarget,&local_38,local_b8);
              }
              AdjustPlayerAngle(&t1->super_AActor,&t);
              ppVar4 = local_a8;
              if (iVar3 < 1) {
                return 0;
              }
              pAVar5 = local_a8->ReadyWeapon;
              if (pAVar5 == (AWeapon *)0x0) {
                return 0;
              }
              AWeapon::DepleteAmmo(pAVar5,pAVar5->bAltFire,false,-1);
              pAVar10 = GC::ReadBarrier<AAmmo>((AAmmo **)&pAVar5->Ammo1);
              if ((pAVar10 != (AAmmo *)0x0) &&
                 (pAVar10 = GC::ReadBarrier<AAmmo>((AAmmo **)&pAVar5->Ammo1),
                 (pAVar10->super_AInventory).Amount != 0)) {
                return 0;
              }
              if (((pAVar5->super_AInventory).field_0x4dc & 0x80) != 0) {
                pAVar10 = GC::ReadBarrier<AAmmo>((AAmmo **)&pAVar5->Ammo2);
                if ((pAVar10 != (AAmmo *)0x0) &&
                   (pAVar10 = GC::ReadBarrier<AAmmo>((AAmmo **)&pAVar5->Ammo2),
                   (pAVar10->super_AInventory).Amount != 0)) {
                  return 0;
                }
              }
              pAVar5 = ppVar4->ReadyWeapon;
              FName::FName(&local_78,"Fire");
              pFVar11 = AActor::FindState((AActor *)pAVar5,&local_78);
              P_SetPsprite(ppVar4,PSP_WEAPON,pFVar11 + 5,false);
              return 0;
            }
          }
          iVar13 = iVar13 + iVar16;
        }
        iVar16 = iVar16 + -2;
      }
      (t1->super_AActor).weaponspecial = 0;
      pPVar1 = (PClass *)(t1->super_AActor).Angles.Yaw.Degrees;
      local_58._16_8_ = (DObject *)0x0;
      local_58._24_8_ = pPVar1;
      P_AimLineAttack((AActor *)local_58,(DAngle *)t1,64.0,
                      (FTranslatedLineTarget *)(local_58 + 0x18),(DAngle *)0x0,(int)local_58 + 0x10,
                      (AActor *)0x0,(AActor *)0x0);
      local_74.Index = 0x84;
      local_58._8_8_ = pPVar1;
      P_LineAttack(&t1->super_AActor,(DAngle *)(local_58 + 8),64.0,(DAngle *)local_58,damage,
                   &local_74,local_b0,1,(FTranslatedLineTarget *)0x0,(int *)0x0);
    }
    return 0;
  }
  pcVar12 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_00538ef3:
  __assert_fail(pcVar12,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                ,200,"int AF_A_FAxeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FAxeAttack)
{
	PARAM_ACTION_PROLOGUE;

	DAngle angle;
	int power;
	int damage;
	DAngle slope;
	int i;
	int useMana;
	player_t *player;
	AWeapon *weapon;
	PClassActor *pufftype;
	FTranslatedLineTarget t;

	if (nullptr == (player = self->player))
	{
		return 0;
	}
	AActor *pmo=player->mo;

	damage = 40+(pr_axeatk()&15);
	damage += pr_axeatk()&7;
	power = 0;
	weapon = player->ReadyWeapon;
	if (player->ReadyWeapon->Ammo1->Amount > 0)
	{
		damage <<= 1;
		power = 6;
		pufftype = PClass::FindActor ("AxePuffGlow");
		useMana = 1;
	}
	else
	{
		pufftype = PClass::FindActor ("AxePuff");
		useMana = 0;
	}
	for (i = 0; i < 16; i++)
	{
		for (int j = 1; j >= -1; j -= 2)
		{
			angle = pmo->Angles.Yaw + j*i*(45. / 16);
			slope = P_AimLineAttack(pmo, angle, AXERANGE, &t);
			if (t.linetarget)
			{
				P_LineAttack(pmo, angle, AXERANGE, slope, damage, NAME_Melee, pufftype, true, &t);
				if (t.linetarget != nullptr)
				{
					if (t.linetarget->flags3&MF3_ISMONSTER || t.linetarget->player)
					{
						t.linetarget->Thrust(t.angleFromSource, power);
					}
					AdjustPlayerAngle(pmo, &t);
					useMana++;
					goto axedone;
				}
			}
		}
	}
	// didn't find any creatures, so try to strike any walls
	pmo->weaponspecial = 0;

	angle = pmo->Angles.Yaw;
	slope = P_AimLineAttack (pmo, angle, MELEERANGE);
	P_LineAttack (pmo, angle, MELEERANGE, slope, damage, NAME_Melee, pufftype, true);

axedone:
	if (useMana == 2)
	{
		AWeapon *weapon = player->ReadyWeapon;
		if (weapon != nullptr)
		{
			weapon->DepleteAmmo (weapon->bAltFire, false);

			if ((weapon->Ammo1 == nullptr || weapon->Ammo1->Amount == 0) &&
				(!(weapon->WeaponFlags & WIF_PRIMARY_USES_BOTH) ||
				  weapon->Ammo2 == nullptr || weapon->Ammo2->Amount == 0))
			{
				P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->FindState ("Fire") + 5);
			}
		}
	}
	return 0;		
}